

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

int CVmObjClass::s_getp_is_int_class(vm_val_t *result,uint *argc)

{
  vm_datatype_t vVar1;
  int iVar2;
  
  if ((s_getp_is_int_class(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&s_getp_is_int_class(vm_val_t*,unsigned_int*)::desc), iVar2 != 0))
  {
    s_getp_is_int_class::desc.min_argc_ = 1;
    s_getp_is_int_class::desc.opt_argc_ = 0;
    s_getp_is_int_class::desc.varargs_ = 0;
    __cxa_guard_release(&s_getp_is_int_class(vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(result,argc,&s_getp_is_int_class::desc);
  if (iVar2 == 0) {
    if ((sp_[-1].typ == VM_OBJ) && (iVar2 = is_intcls_obj(sp_[-1].val.obj), iVar2 != 0)) {
      vVar1 = VM_TRUE;
    }
    else {
      vVar1 = VM_NIL;
    }
    result->typ = vVar1;
    sp_ = sp_ + -1;
    return 1;
  }
  return 1;
}

Assistant:

int CVmObjClass::s_getp_is_int_class(VMG_ vm_val_t *result, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(result, argc, &desc))
        return TRUE;

    /* return true if we have an object of type intrinsic class */
    vm_val_t *v = G_stk->get(0);
    result->set_logical(v->typ == VM_OBJ && is_intcls_obj(vmg_ v->val.obj));

    /* discard the argument */
    G_stk->discard();

    /* handled */
    return TRUE;
}